

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_by_name.c
# Opt level: O2

int pull_by_name(char *input_file,FILE *names_fp,int min,int max,int length,int exclude,int convert,
                int just_count)

{
  int iVar1;
  char *pcVar2;
  gzFile pgVar3;
  kseq_t *seq;
  kstream_t *pkVar4;
  uchar *puVar5;
  lookup_t *plVar6;
  int *piVar7;
  char *pcVar8;
  FILE *pFVar9;
  uint uVar10;
  uint local_48;
  char *line;
  gzFile local_38;
  
  line = (char *)malloc(0x50);
  pFVar9 = _stderr;
  pcVar2 = progname;
  if (line == (char *)0x0) {
    piVar7 = __errno_location();
    input_file = strerror(*piVar7);
    pcVar8 = "%s - line malloc: %s\n";
  }
  else {
    while( true ) {
      iVar1 = getl(&line,names_fp);
      if (iVar1 == -1) break;
      pcVar2 = parse_name(line);
      if (pcVar2 != (char *)0x0) {
        add_name(pcVar2);
      }
    }
    free(line);
    if (verbose_flag != 0) {
      fputc(10,_stderr);
      pFVar9 = _stderr;
      uVar10 = hash_key_count();
      fprintf(pFVar9,"done reading from input (%d entries)\n",(ulong)uVar10);
    }
    pgVar3 = (gzFile)gzopen(input_file,"r");
    if (pgVar3 != (gzFile)0x0) {
      seq = (kseq_t *)calloc(1,0x70);
      pkVar4 = (kstream_t *)calloc(1,0x20);
      pkVar4->f = pgVar3;
      puVar5 = (uchar *)malloc(0xffff);
      pkVar4->buf = puVar5;
      seq->f = pkVar4;
      kseq_read(seq);
      pcVar2 = (seq->qual).s;
      local_38 = pgVar3;
      gzrewind();
      pkVar4 = seq->f;
      pkVar4->begin = 0;
      pkVar4->end = 0;
      pkVar4->is_eof = 0;
      seq->last_char = 0;
      local_48 = 0;
      if (verbose_flag != 0) {
        pcVar8 = "Input is FASTQ format\n";
        if (pcVar2 == (char *)0x0) {
          pcVar8 = "Input is FASTA format\n";
        }
        fwrite(pcVar8,0x16,1,_stderr);
      }
      uVar10 = 0;
      do {
        while( true ) {
          iVar1 = kseq_read(seq);
          pcVar8 = (seq->name).s;
          if (iVar1 < 0) {
            free(pcVar8);
            free((seq->comment).s);
            free((seq->seq).s);
            free((seq->qual).s);
            pkVar4 = seq->f;
            if (pkVar4 != (kstream_t *)0x0) {
              free(pkVar4->buf);
              free(pkVar4);
            }
            free(seq);
            gzclose(local_38);
            delete_hash();
            if (just_count != 0) {
              fprintf(_stdout,"Total output: %i\n",(ulong)uVar10);
              if (exclude != 0) {
                fprintf(_stdout,"Total excluded: %i\n",(ulong)local_48);
              }
            }
            if (verbose_flag != 0) {
              fprintf(_stderr,"Processed %i entries\n",(ulong)uVar10);
              if (exclude != 0) {
                fprintf(_stderr,"Excluded %i entries\n",(ulong)local_48);
              }
            }
            return uVar10;
          }
          plVar6 = find_name(pcVar8);
          if (exclude != 0) break;
          if (plVar6 == (lookup_t *)0x0) goto LAB_00103d4c;
LAB_00103d23:
          iVar1 = size_filter(seq,(uint)(pcVar2 == (char *)0x0),min,max,length,convert,just_count);
          uVar10 = uVar10 + iVar1;
        }
        if (plVar6 == (lookup_t *)0x0) goto LAB_00103d23;
LAB_00103d4c:
        local_48 = local_48 + 1;
      } while( true );
    }
    pcVar8 = "%s - Couldn\'t open fasta file %s\n";
    pcVar2 = progname;
    pFVar9 = _stderr;
  }
  fprintf(pFVar9,pcVar8,pcVar2,input_file);
  exit(1);
}

Assistant:

__KSEQ_READ(static)

/*
extern char const *progname;
extern int verbose_flag;
*/

int pull_by_name(char *input_file, FILE *names_fp, int min, int max, int length, int exclude, int convert, int just_count) {
	gzFile fp;
	int i,l,capacity=80;
	int count=0,excluded=0;
	int is_fasta = -1;
	char *fasta_name;
	char *line;
	kseq_t *seq;

	/* get some space for the line */
	line = malloc(sizeof(char) * capacity); /* get memory allocated */
	if (!line) {
		fprintf(stderr, "%s - line malloc: %s\n",progname, strerror(errno));
		exit(EXIT_FAILURE);
	}

	while((i = getl(&line, names_fp)) != -1) {
		fasta_name = parse_name(line);
		if (fasta_name) {
			add_name(fasta_name);             /* add fasta_name to hash */
		}
	}

	free(line); /* free up line */

	if (verbose_flag) {
		fprintf(stderr,"\n");
		fprintf(stderr,"done reading from input (%d entries)\n", hash_key_count());
	}
	/*print_hash();*/


	/* open fasta file */
	fp = gzopen(input_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,input_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp); /* initialize kseq */

	/* determine file type */
	l = kseq_read(seq); /* read the first sequence */
	is_fasta = seq->qual.s == NULL ? 1 : 0;
	gzrewind(fp); /* rewind to beginning for main loop */
	kseq_rewind(seq);

	if (verbose_flag) {
		if (is_fasta)
			fprintf(stderr, "Input is FASTA format\n");
		else
			fprintf(stderr, "Input is FASTQ format\n");
	}

	/* search through list and see if this header matches */
	while((l = kseq_read(seq)) >= 0) {
		if (exclude == 0) { /* INCLUDE names from names file */
			if (find_name(seq->name.s))            /* found name in list */
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
			else
				excluded++;
		} else { /* EXCLUDE names from names file */
			if (find_name(seq->name.s))            /* found name in list */
				excluded++;
			else
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
		}
	}
	kseq_destroy(seq);
	gzclose(fp); /* done reading file */

	delete_hash(); /* free the list nodes */

	if (just_count) {
		fprintf(stdout, "Total output: %i\n", count);
		if (exclude)
			fprintf(stdout, "Total excluded: %i\n", excluded);
	}

	if (verbose_flag) {
		fprintf(stderr,"Processed %i entries\n",count);
		if (exclude)
			fprintf(stderr,"Excluded %i entries\n",excluded);
	}
	return count;
}